

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_5f811d::BracedExpr::printLeft(BracedExpr *this,OutputStream *S)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  Node *pNVar4;
  
  bVar1 = this->IsArray;
  OutputStream::grow(S,1);
  sVar2 = S->CurrentPosition;
  S->CurrentPosition = sVar2 + 1;
  if (bVar1 == true) {
    S->Buffer[sVar2] = '[';
    pNVar4 = this->Elem;
    (*pNVar4->_vptr_Node[4])(pNVar4,S);
    if (pNVar4->RHSComponentCache != No) {
      (*pNVar4->_vptr_Node[5])(pNVar4,S);
    }
    OutputStream::grow(S,1);
    sVar2 = S->CurrentPosition;
    S->CurrentPosition = sVar2 + 1;
    S->Buffer[sVar2] = ']';
  }
  else {
    S->Buffer[sVar2] = '.';
    pNVar4 = this->Elem;
    (*pNVar4->_vptr_Node[4])(pNVar4,S);
    if (pNVar4->RHSComponentCache != No) {
      (*pNVar4->_vptr_Node[5])(pNVar4,S);
    }
  }
  pNVar4 = this->Init;
  if ((pNVar4->K & ~KDotSuffix) != KBracedExpr) {
    OutputStream::grow(S,3);
    pcVar3 = S->Buffer;
    sVar2 = S->CurrentPosition;
    pcVar3[sVar2 + 2] = ' ';
    pcVar3 = pcVar3 + sVar2;
    pcVar3[0] = ' ';
    pcVar3[1] = '=';
    S->CurrentPosition = S->CurrentPosition + 3;
    pNVar4 = this->Init;
  }
  (*pNVar4->_vptr_Node[4])(pNVar4,S);
  if (pNVar4->RHSComponentCache == No) {
    return;
  }
  (*pNVar4->_vptr_Node[5])(pNVar4,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    if (IsArray) {
      S += '[';
      Elem->print(S);
      S += ']';
    } else {
      S += '.';
      Elem->print(S);
    }
    if (Init->getKind() != KBracedExpr && Init->getKind() != KBracedRangeExpr)
      S += " = ";
    Init->print(S);
  }